

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86::forward(Padding_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 *puVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Allocator *pAVar7;
  size_t sVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int *piVar19;
  Mat *pMVar20;
  ulong uVar21;
  Mat *pMVar22;
  undefined4 *puVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int *piVar28;
  int iVar29;
  undefined4 *puVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  int iVar36;
  float fVar37;
  int iVar38;
  float fVar39;
  uint _c;
  int iVar40;
  undefined1 auVar41 [16];
  __m128 pad_value;
  __m128 pad_value_1;
  
  uVar15 = (this->super_Padding).top;
  iVar12 = (this->super_Padding).bottom;
  uVar32._0_4_ = (this->super_Padding).left;
  uVar32._4_4_ = (this->super_Padding).right;
  uVar18._0_4_ = (this->super_Padding).front;
  uVar18._4_4_ = (this->super_Padding).behind;
  auVar41._0_4_ = -(uint)((undefined4)uVar32 == 0);
  auVar41._4_4_ = -(uint)(uVar32._4_4_ == 0);
  auVar41._8_4_ = -(uint)((undefined4)uVar18 == 0);
  auVar41._12_4_ = -(uint)(uVar18._4_4_ == 0);
  iVar16 = movmskps((int)top_blob,auVar41);
  if ((iVar12 == 0 && uVar15 == 0) && iVar16 == 0xf) {
    if (top_blob != bottom_blob) {
      piVar19 = bottom_blob->refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + 1;
        UNLOCK();
      }
      piVar19 = top_blob->refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar19 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar19;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar12 = bottom_blob->w;
      iVar16 = bottom_blob->h;
      iVar24 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar12;
      top_blob->h = iVar16;
      top_blob->d = iVar24;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  iVar16 = bottom_blob->elempack;
  uVar13 = bottom_blob->elemsize;
  if (iVar16 == 0) {
    _c = bottom_blob->c;
  }
  else {
    if (((int)uVar13 * 8) / iVar16 == 8) {
      iVar12 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar12;
    }
    iVar24 = bottom_blob->w;
    iVar5 = bottom_blob->h;
    iVar29 = bottom_blob->d;
    _c = bottom_blob->c;
    if (iVar16 == 4) {
      switch(bottom_blob->dims) {
      case 1:
        if ((((uVar32 & 3) == 0) && ((uVar32._4_4_ + (undefined4)uVar32 & 3) == 0)) &&
           ((this->super_Padding).type == 0)) {
          Mat::create(top_blob,uVar32._4_4_ + (undefined4)uVar32 + iVar24 * 4 >> 2,
                      uVar13 & 0xfffffffffffffffc,4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            pad_value[1] = (this->super_Padding).value;
            pad_value[0] = pad_value[1];
            pad_value[3] = pad_value[1];
            pad_value[2] = pad_value[1];
            iVar12 = (this->super_Padding).left;
            iVar16 = iVar12 + 3;
            if (-1 < iVar12) {
              iVar16 = iVar12;
            }
            iVar12 = (this->super_Padding).right;
            iVar24 = iVar12 + 3;
            if (-1 < iVar12) {
              iVar24 = iVar12;
            }
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0
                       ,iVar16 >> 2,iVar24 >> 2,&pad_value);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        if ((((uVar15 & 3) == 0) && (uVar15 = uVar15 + iVar5 * 4 + iVar12, (uVar15 & 3) == 0)) &&
           ((this->super_Padding).type == 0)) {
          Mat::create(top_blob,uVar32._4_4_ + (undefined4)uVar32 + iVar24,(int)uVar15 >> 2,
                      uVar13 & 0xfffffffffffffffc,4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            pad_value[1] = (this->super_Padding).value;
            pad_value[0] = pad_value[1];
            pad_value[3] = pad_value[1];
            pad_value[2] = pad_value[1];
            iVar12 = (this->super_Padding).top;
            iVar16 = (this->super_Padding).bottom;
            iVar24 = iVar12 + 3;
            if (-1 < iVar12) {
              iVar24 = iVar12;
            }
            iVar12 = iVar16 + 3;
            if (-1 < iVar16) {
              iVar12 = iVar16;
            }
            padding_constant_pack4_sse
                      ((ncnn *)bottom_blob,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                       iVar24 >> 2,iVar12 >> 2,(this->super_Padding).left,
                       (this->super_Padding).right,&pad_value);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar14 = uVar18._4_4_ + (undefined4)uVar18 + _c * 4;
        bVar33 = (uVar14 & 3) == 0;
        if (((uVar18 & 3) == 0 && bVar33) &&
           ((uVar14 == _c * 4 || ((this->super_Padding).type == 0)))) {
          uVar14 = (int)uVar14 >> 2;
          Mat::create(top_blob,uVar32._4_4_ + (undefined4)uVar32 + iVar24,uVar15 + iVar12 + iVar5,
                      uVar14,(uVar13 >> 2) << bVar33 * '\x02',4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar12 = (this->super_Padding).front;
            iVar16 = iVar12 + 3;
            if (-1 < iVar12) {
              iVar16 = iVar12;
            }
            if ((int)uVar14 < 1) {
              return 0;
            }
            uVar32 = 0;
            do {
              uVar18 = top_blob->elemsize;
              uVar21 = (long)top_blob->h * (long)top_blob->w;
              uVar13 = (uVar18 * uVar21 + 0xf & 0xfffffffffffffff0) / uVar18;
              if (top_blob->dims == 4) {
                uVar13 = uVar21;
              }
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                pad_value_1[0] = (this->super_Padding).value;
                pad_value_1[1] = pad_value_1[0];
                pad_value_1[2] = pad_value_1[0];
                pad_value_1[3] = pad_value_1[0];
              }
              else {
                pfVar1 = (float *)((long)(this->super_Padding).per_channel_pad_data.data +
                                  uVar32 * 0x10);
                pad_value_1[0] = *pfVar1;
                pad_value_1[1] = pfVar1[1];
                pad_value_1[2] = pfVar1[2];
                pad_value_1[3] = pfVar1[3];
              }
              pMVar20 = (Mat *)(top_blob->cstep * uVar32 * uVar18 + (long)top_blob->data);
              uVar15 = (int)uVar32 - (iVar16 >> 2);
              if ((int)uVar15 < 0 || (int)_c <= (int)uVar15) {
                iVar12 = top_blob->d * (int)uVar13;
                if (0 < iVar12) {
                  do {
                    *(float *)&pMVar20->data = pad_value_1[0];
                    *(float *)((long)&pMVar20->data + 4) = pad_value_1[1];
                    *(float *)&pMVar20->refcount = pad_value_1[2];
                    *(float *)((long)&pMVar20->refcount + 4) = pad_value_1[3];
                    pMVar20 = (Mat *)&pMVar20->elemsize;
                    iVar12 = iVar12 + -1;
                  } while (iVar12 != 0);
                }
              }
              else {
                uVar4 = bottom_blob->w;
                iVar12 = bottom_blob->h;
                piVar19 = (int *)((ulong)uVar15 * bottom_blob->cstep * bottom_blob->elemsize +
                                 (long)bottom_blob->data);
                pAVar7 = bottom_blob->allocator;
                pad_value[2] = 0.0;
                pad_value[3] = 0.0;
                iVar24 = (this->super_Padding).type;
                pad_value._0_8_ = piVar19;
                if (iVar24 == 0) {
                  padding_constant_pack4_sse
                            ((ncnn *)pad_value,pMVar20,(Mat *)(ulong)(uint)top_blob->w,
                             (this->super_Padding).top,(this->super_Padding).bottom,
                             (this->super_Padding).left,(this->super_Padding).right,&pad_value_1);
                  iVar24 = (this->super_Padding).type;
                }
                if (iVar24 == 1) {
                  iVar24 = (this->super_Padding).top;
                  iVar5 = (this->super_Padding).bottom;
                  iVar29 = (this->super_Padding).left;
                  iVar17 = (this->super_Padding).right;
                  pMVar22 = pMVar20;
                  if (0 < iVar24) {
                    iVar25 = 0;
                    do {
                      iVar36 = *piVar19;
                      iVar38 = piVar19[1];
                      iVar40 = piVar19[2];
                      iVar26 = piVar19[3];
                      iVar27 = iVar29;
                      if (0 < iVar29) {
                        do {
                          *(int *)&pMVar22->data = iVar36;
                          *(int *)((long)&pMVar22->data + 4) = iVar38;
                          *(int *)&pMVar22->refcount = iVar40;
                          *(int *)((long)&pMVar22->refcount + 4) = iVar26;
                          pMVar22 = (Mat *)&pMVar22->elemsize;
                          iVar27 = iVar27 + -1;
                        } while (iVar27 != 0);
                      }
                      if (0 < (int)uVar4) {
                        iVar27 = 0;
                        piVar28 = piVar19;
                        do {
                          iVar36 = *piVar28;
                          iVar38 = piVar28[1];
                          iVar40 = piVar28[2];
                          iVar26 = piVar28[3];
                          *(int *)&pMVar22->data = iVar36;
                          *(int *)((long)&pMVar22->data + 4) = iVar38;
                          *(int *)&pMVar22->refcount = iVar40;
                          *(int *)((long)&pMVar22->refcount + 4) = iVar26;
                          piVar28 = piVar28 + 4;
                          pMVar22 = (Mat *)&pMVar22->elemsize;
                          iVar27 = iVar27 + 1;
                        } while (iVar27 < (int)uVar4);
                      }
                      iVar27 = iVar17;
                      if (0 < iVar17) {
                        do {
                          *(int *)&pMVar22->data = iVar36;
                          *(int *)((long)&pMVar22->data + 4) = iVar38;
                          *(int *)&pMVar22->refcount = iVar40;
                          *(int *)((long)&pMVar22->refcount + 4) = iVar26;
                          pMVar22 = (Mat *)&pMVar22->elemsize;
                          iVar27 = iVar27 + -1;
                        } while (iVar27 != 0);
                      }
                      iVar25 = iVar25 + 1;
                    } while (iVar25 != iVar24);
                  }
                  if (0 < iVar12) {
                    iVar24 = 0;
                    do {
                      iVar25 = *piVar19;
                      iVar36 = piVar19[1];
                      iVar38 = piVar19[2];
                      iVar40 = piVar19[3];
                      iVar26 = iVar29;
                      if (0 < iVar29) {
                        do {
                          *(int *)&pMVar22->data = iVar25;
                          *(int *)((long)&pMVar22->data + 4) = iVar36;
                          *(int *)&pMVar22->refcount = iVar38;
                          *(int *)((long)&pMVar22->refcount + 4) = iVar40;
                          pMVar22 = (Mat *)&pMVar22->elemsize;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      if (0 < (int)uVar4) {
                        iVar26 = 0;
                        do {
                          iVar25 = *piVar19;
                          iVar36 = piVar19[1];
                          iVar38 = piVar19[2];
                          iVar40 = piVar19[3];
                          *(int *)&pMVar22->data = iVar25;
                          *(int *)((long)&pMVar22->data + 4) = iVar36;
                          *(int *)&pMVar22->refcount = iVar38;
                          *(int *)((long)&pMVar22->refcount + 4) = iVar40;
                          piVar19 = piVar19 + 4;
                          pMVar22 = (Mat *)&pMVar22->elemsize;
                          iVar26 = iVar26 + 1;
                        } while (iVar26 < (int)uVar4);
                      }
                      iVar26 = iVar17;
                      if (0 < iVar17) {
                        do {
                          *(int *)&pMVar22->data = iVar25;
                          *(int *)((long)&pMVar22->data + 4) = iVar36;
                          *(int *)&pMVar22->refcount = iVar38;
                          *(int *)((long)&pMVar22->refcount + 4) = iVar40;
                          pMVar22 = (Mat *)&pMVar22->elemsize;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      iVar24 = iVar24 + 1;
                    } while (iVar24 < iVar12);
                  }
                  if (0 < iVar5) {
                    piVar19 = piVar19 + (long)(int)uVar4 * -4;
                    iVar24 = 0;
                    do {
                      iVar25 = *piVar19;
                      iVar36 = piVar19[1];
                      iVar38 = piVar19[2];
                      iVar40 = piVar19[3];
                      iVar26 = iVar29;
                      if (0 < iVar29) {
                        do {
                          *(int *)&pMVar22->data = iVar25;
                          *(int *)((long)&pMVar22->data + 4) = iVar36;
                          *(int *)&pMVar22->refcount = iVar38;
                          *(int *)((long)&pMVar22->refcount + 4) = iVar40;
                          pMVar22 = (Mat *)&pMVar22->elemsize;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      if (0 < (int)uVar4) {
                        iVar26 = 0;
                        piVar28 = piVar19;
                        do {
                          iVar25 = *piVar28;
                          iVar36 = piVar28[1];
                          iVar38 = piVar28[2];
                          iVar40 = piVar28[3];
                          *(int *)&pMVar22->data = iVar25;
                          *(int *)((long)&pMVar22->data + 4) = iVar36;
                          *(int *)&pMVar22->refcount = iVar38;
                          *(int *)((long)&pMVar22->refcount + 4) = iVar40;
                          piVar28 = piVar28 + 4;
                          pMVar22 = (Mat *)&pMVar22->elemsize;
                          iVar26 = iVar26 + 1;
                        } while (iVar26 < (int)uVar4);
                      }
                      iVar26 = iVar17;
                      if (0 < iVar17) {
                        do {
                          *(int *)&pMVar22->data = iVar25;
                          *(int *)((long)&pMVar22->data + 4) = iVar36;
                          *(int *)&pMVar22->refcount = iVar38;
                          *(int *)((long)&pMVar22->refcount + 4) = iVar40;
                          pMVar22 = (Mat *)&pMVar22->elemsize;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      iVar24 = iVar24 + 1;
                    } while (iVar24 != iVar5);
                  }
                }
                if ((this->super_Padding).type == 2) {
                  iVar24 = (this->super_Padding).top;
                  iVar5 = (this->super_Padding).bottom;
                  uVar15 = (this->super_Padding).left;
                  uVar18 = (ulong)uVar15;
                  uVar6 = (this->super_Padding).right;
                  uVar13 = (ulong)uVar6;
                  puVar23 = (undefined4 *)((long)(int)(iVar24 * uVar4 * 4) * 4 + pad_value._0_8_);
                  if (0 < iVar24) {
                    iVar29 = 0;
                    do {
                      lVar31 = uVar18 << 4;
                      if (0 < (int)uVar15) {
                        do {
                          puVar30 = (undefined4 *)((long)puVar23 + lVar31);
                          uVar9 = puVar30[1];
                          uVar10 = puVar30[2];
                          uVar11 = puVar30[3];
                          *(undefined4 *)&pMVar20->data = *puVar30;
                          *(undefined4 *)((long)&pMVar20->data + 4) = uVar9;
                          *(undefined4 *)&pMVar20->refcount = uVar10;
                          *(undefined4 *)((long)&pMVar20->refcount + 4) = uVar11;
                          pMVar20 = (Mat *)&pMVar20->elemsize;
                          lVar31 = lVar31 + -0x10;
                        } while (lVar31 != 0);
                      }
                      puVar30 = puVar23;
                      if (0 < (int)uVar4) {
                        iVar17 = 0;
                        do {
                          uVar9 = puVar30[1];
                          iVar25 = puVar30[2];
                          uVar10 = puVar30[3];
                          *(undefined4 *)&pMVar20->data = *puVar30;
                          *(undefined4 *)((long)&pMVar20->data + 4) = uVar9;
                          *(int *)&pMVar20->refcount = iVar25;
                          *(undefined4 *)((long)&pMVar20->refcount + 4) = uVar10;
                          puVar30 = puVar30 + 4;
                          pMVar20 = (Mat *)&pMVar20->elemsize;
                          iVar17 = iVar17 + 1;
                        } while (iVar17 < (int)uVar4);
                      }
                      if (0 < (int)uVar6) {
                        lVar31 = -0x20;
                        do {
                          puVar2 = (undefined4 *)((long)puVar30 + lVar31);
                          uVar9 = puVar2[1];
                          iVar17 = puVar2[2];
                          iVar25 = puVar2[3];
                          *(undefined4 *)&pMVar20->data = *puVar2;
                          *(undefined4 *)((long)&pMVar20->data + 4) = uVar9;
                          *(int *)&pMVar20->refcount = iVar17;
                          *(int *)((long)&pMVar20->refcount + 4) = iVar25;
                          pMVar20 = (Mat *)&pMVar20->elemsize;
                          lVar3 = uVar13 * 0x10 + lVar31;
                          lVar31 = lVar31 + -0x10;
                        } while (lVar3 != -0x10);
                      }
                      puVar23 = puVar23 + -(long)(int)(uVar4 * 4);
                      iVar29 = iVar29 + 1;
                    } while (iVar29 != iVar24);
                  }
                  if (0 < iVar12) {
                    iVar24 = 0;
                    do {
                      lVar31 = uVar18 << 4;
                      if (0 < (int)uVar15) {
                        do {
                          puVar30 = (undefined4 *)((long)puVar23 + lVar31);
                          uVar9 = puVar30[1];
                          uVar10 = puVar30[2];
                          uVar11 = puVar30[3];
                          *(undefined4 *)&pMVar20->data = *puVar30;
                          *(undefined4 *)((long)&pMVar20->data + 4) = uVar9;
                          *(undefined4 *)&pMVar20->refcount = uVar10;
                          *(undefined4 *)((long)&pMVar20->refcount + 4) = uVar11;
                          pMVar20 = (Mat *)&pMVar20->elemsize;
                          lVar31 = lVar31 + -0x10;
                        } while (lVar31 != 0);
                      }
                      if (0 < (int)uVar4) {
                        iVar29 = 0;
                        do {
                          uVar9 = puVar23[1];
                          iVar17 = puVar23[2];
                          iVar25 = puVar23[3];
                          *(undefined4 *)&pMVar20->data = *puVar23;
                          *(undefined4 *)((long)&pMVar20->data + 4) = uVar9;
                          *(int *)&pMVar20->refcount = iVar17;
                          *(int *)((long)&pMVar20->refcount + 4) = iVar25;
                          puVar23 = puVar23 + 4;
                          pMVar20 = (Mat *)&pMVar20->elemsize;
                          iVar29 = iVar29 + 1;
                        } while (iVar29 < (int)uVar4);
                      }
                      if (0 < (int)uVar6) {
                        lVar31 = -0x20;
                        do {
                          puVar30 = (undefined4 *)((long)puVar23 + lVar31);
                          uVar9 = puVar30[1];
                          iVar29 = puVar30[2];
                          uVar10 = puVar30[3];
                          *(undefined4 *)&pMVar20->data = *puVar30;
                          *(undefined4 *)((long)&pMVar20->data + 4) = uVar9;
                          *(int *)&pMVar20->refcount = iVar29;
                          *(undefined4 *)((long)&pMVar20->refcount + 4) = uVar10;
                          pMVar20 = (Mat *)&pMVar20->elemsize;
                          lVar3 = uVar13 * 0x10 + lVar31;
                          lVar31 = lVar31 + -0x10;
                        } while (lVar3 != -0x10);
                      }
                      iVar24 = iVar24 + 1;
                    } while (iVar24 < iVar12);
                  }
                  if (0 < iVar5) {
                    uVar21 = (ulong)(int)uVar4;
                    puVar23 = puVar23 + uVar21 * -8;
                    iVar12 = 0;
                    do {
                      lVar31 = uVar18 << 4;
                      if (0 < (int)uVar15) {
                        do {
                          puVar30 = (undefined4 *)((long)puVar23 + lVar31);
                          uVar9 = puVar30[1];
                          uVar10 = puVar30[2];
                          uVar11 = puVar30[3];
                          *(undefined4 *)&pMVar20->data = *puVar30;
                          *(undefined4 *)((long)&pMVar20->data + 4) = uVar9;
                          *(undefined4 *)&pMVar20->refcount = uVar10;
                          *(undefined4 *)((long)&pMVar20->refcount + 4) = uVar11;
                          pMVar20 = (Mat *)&pMVar20->elemsize;
                          lVar31 = lVar31 + -0x10;
                        } while (lVar31 != 0);
                        uVar21 = (ulong)uVar4;
                      }
                      puVar30 = puVar23;
                      if (0 < (int)uVar21) {
                        iVar24 = 0;
                        do {
                          uVar9 = puVar30[1];
                          iVar29 = puVar30[2];
                          uVar10 = puVar30[3];
                          *(undefined4 *)&pMVar20->data = *puVar30;
                          *(undefined4 *)((long)&pMVar20->data + 4) = uVar9;
                          *(int *)&pMVar20->refcount = iVar29;
                          *(undefined4 *)((long)&pMVar20->refcount + 4) = uVar10;
                          puVar30 = puVar30 + 4;
                          pMVar20 = (Mat *)&pMVar20->elemsize;
                          iVar24 = iVar24 + 1;
                          uVar21 = (ulong)uVar4;
                        } while (iVar24 < (int)uVar4);
                      }
                      if (0 < (int)uVar6) {
                        lVar31 = -0x20;
                        do {
                          puVar2 = (undefined4 *)((long)puVar30 + lVar31);
                          uVar9 = puVar2[1];
                          iVar24 = puVar2[2];
                          iVar29 = puVar2[3];
                          *(undefined4 *)&pMVar20->data = *puVar2;
                          *(undefined4 *)((long)&pMVar20->data + 4) = uVar9;
                          *(int *)&pMVar20->refcount = iVar24;
                          *(int *)((long)&pMVar20->refcount + 4) = iVar29;
                          pMVar20 = (Mat *)&pMVar20->elemsize;
                          lVar3 = uVar13 * 0x10 + lVar31;
                          lVar31 = lVar31 + -0x10;
                        } while (lVar3 != -0x10);
                        uVar21 = (ulong)uVar4;
                      }
                      puVar23 = puVar23 + -(long)((int)uVar21 * 4);
                      iVar12 = iVar12 + 1;
                    } while (iVar12 != iVar5);
                  }
                }
                if (pad_value._8_8_ != 0) {
                  LOCK();
                  *(int *)pad_value._8_8_ = *(int *)pad_value._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)pad_value._8_8_ == 0) {
                    if (pAVar7 == (Allocator *)0x0) {
                      if (pad_value._0_8_ != 0) {
                        free((void *)pad_value._0_8_);
                      }
                    }
                    else {
                      (*pAVar7->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar14);
            return 0;
          }
          return -100;
        }
        break;
      case 4:
        if ((this->super_Padding).type == 0) {
          uVar14 = uVar18._4_4_ + (undefined4)uVar18 + iVar29;
          Mat::create(top_blob,uVar32._4_4_ + (undefined4)uVar32 + iVar24,uVar15 + iVar12 + iVar5,
                      uVar14,_c,uVar13,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)_c < 1) {
              return 0;
            }
            uVar32 = 0;
            do {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar34 = (this->super_Padding).value;
                fVar35 = fVar34;
                fVar37 = fVar34;
                fVar39 = fVar34;
              }
              else {
                pfVar1 = (float *)((long)(this->super_Padding).per_channel_pad_data.data +
                                  uVar32 * 0x10);
                fVar34 = *pfVar1;
                fVar35 = pfVar1[1];
                fVar37 = pfVar1[2];
                fVar39 = pfVar1[3];
              }
              pad_value_1[1] = fVar35;
              pad_value_1[0] = fVar34;
              pad_value_1[3] = fVar39;
              pad_value_1[2] = fVar37;
              if (0 < (int)uVar14) {
                uVar18 = 0;
                do {
                  uVar13 = (long)top_blob->h * (long)top_blob->w;
                  pMVar20 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar18 * uVar13 +
                                   top_blob->cstep * uVar32 * top_blob->elemsize);
                  uVar15 = (int)uVar18 - (this->super_Padding).front;
                  if ((int)uVar15 < 0 || iVar29 <= (int)uVar15) {
                    if (0 < (int)uVar13) {
                      do {
                        *(float *)&pMVar20->data = fVar34;
                        *(float *)((long)&pMVar20->data + 4) = fVar35;
                        *(float *)&pMVar20->refcount = fVar37;
                        *(float *)((long)&pMVar20->refcount + 4) = fVar39;
                        pMVar20 = (Mat *)&pMVar20->elemsize;
                        uVar15 = (int)uVar13 - 1;
                        uVar13 = (ulong)uVar15;
                      } while (uVar15 != 0);
                    }
                  }
                  else {
                    pad_value._0_8_ =
                         (long)bottom_blob->data +
                         (ulong)uVar15 * bottom_blob->elemsize *
                         (long)bottom_blob->h * (long)bottom_blob->w +
                         bottom_blob->cstep * uVar32 * bottom_blob->elemsize;
                    pad_value[2] = 0.0;
                    pad_value[3] = 0.0;
                    padding_constant_pack4_sse
                              ((ncnn *)pad_value,pMVar20,(Mat *)(long)top_blob->w,
                               (this->super_Padding).top,(this->super_Padding).bottom,
                               (this->super_Padding).left,(this->super_Padding).right,&pad_value_1);
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar18 != uVar14);
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != _c);
            return 0;
          }
          return -100;
        }
      }
    }
  }
  pad_value._0_8_ = bottom_blob->data;
  pad_value._8_8_ = bottom_blob->refcount;
  pAVar7 = bottom_blob->allocator;
  sVar8 = bottom_blob->cstep;
  if ((int *)pad_value._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)pad_value._8_8_ = *(int *)pad_value._8_8_ + 1;
    UNLOCK();
  }
  if (iVar16 != 1) {
    pad_value_1._0_8_ = *(undefined8 *)opt;
    pad_value_1._8_8_ = opt->workspace_allocator;
    convert_packing(bottom_blob,(Mat *)pad_value,1,(Option *)pad_value_1);
    if ((pad_value._0_8_ == 0) || ((long)(int)_c * sVar8 == 0)) {
      iVar12 = -100;
      goto LAB_00401c21;
    }
  }
  iVar12 = Padding::forward(&this->super_Padding,(Mat *)pad_value,top_blob,opt);
LAB_00401c21:
  if (pad_value._8_8_ != 0) {
    LOCK();
    *(int *)pad_value._8_8_ = *(int *)pad_value._8_8_ + -1;
    UNLOCK();
    if (*(int *)pad_value._8_8_ == 0) {
      if (pAVar7 == (Allocator *)0x0) {
        if (pad_value._0_8_ != 0) {
          free((void *)pad_value._0_8_);
        }
      }
      else {
        (*pAVar7->_vptr_Allocator[3])();
      }
    }
  }
  return iVar12;
}

Assistant:

int Padding_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}